

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O1

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CProgram *stm)

{
  CMainClass *pCVar1;
  CClassList *pCVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_40 [8];
  char local_38 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: program\n",0x15);
  pCVar1 = (stm->mainClass)._M_t.super___uniq_ptr_impl<CMainClass,_std::default_delete<CMainClass>_>
           ._M_t.super__Tuple_impl<0UL,_CMainClass_*,_std::default_delete<CMainClass>_>.
           super__Head_base<0UL,_CMainClass_*,_false>._M_head_impl;
  if (pCVar1 == (CMainClass *)0x0) {
    CError::CError((CError *)local_50,&CError::AST_ERROR_abi_cxx11_,(PositionInfo *)&DAT_00000008);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_50);
    pcVar3 = local_40;
    _Var4._M_p = (pointer)local_50;
  }
  else {
    (*(code *)**(undefined8 **)&(pCVar1->super_IWrapper).super_PositionedNode)(pCVar1,this);
    TypeInfo::TypeInfo((TypeInfo *)local_50,VOID);
    (this->lastCalculatedType).isPrimitive = (bool)local_50[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_50._1_3_;
    (this->lastCalculatedType).type = local_50._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_48);
    pcVar3 = local_38;
    _Var4._M_p = local_48._M_p;
  }
  if (_Var4._M_p != pcVar3) {
    operator_delete(_Var4._M_p);
  }
  pCVar2 = (stm->classList)._M_t.super___uniq_ptr_impl<CClassList,_std::default_delete<CClassList>_>
           ._M_t.super__Tuple_impl<0UL,_CClassList_*,_std::default_delete<CClassList>_>.
           super__Head_base<0UL,_CClassList_*,_false>._M_head_impl;
  if (pCVar2 != (CClassList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
    TypeInfo::TypeInfo((TypeInfo *)local_50,VOID);
    (this->lastCalculatedType).isPrimitive = (bool)local_50[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_50._1_3_;
    (this->lastCalculatedType).type = local_50._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_48);
    if (local_48._M_p != local_38) {
      operator_delete(local_48._M_p);
    }
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CProgram &stm )
{
    std::cout << "typechecker: program\n";
    if( stm.mainClass ) {
        stm.mainClass->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.mainClass->position ) );
    }
    if( stm.classList ) {
        stm.classList->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    }
}